

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O3

void __thiscall ON_SectionStyle::SetBoundaryColor(ON_SectionStyle *this,ON_Color *color,bool print)

{
  ON_Color OVar1;
  uint uVar2;
  uint uVar3;
  ON_SectionStylePrivate *pOVar4;
  ON_Color local_24;
  
  uVar2 = ON_Color::operator_cast_to_unsigned_int(&local_24);
  uVar3 = ON_Color::operator_cast_to_unsigned_int(color);
  if (uVar2 != uVar3) {
    pOVar4 = this->m_private;
    if (pOVar4 == (ON_SectionStylePrivate *)0x0) {
      pOVar4 = (ON_SectionStylePrivate *)operator_new(0x50);
      pOVar4->m_background_fill_mode = None;
      pOVar4->m_fill_rule = ClosedCurves;
      *(undefined2 *)&pOVar4->field_0x2 = 0;
      pOVar4->m_hatch_index = 0;
      pOVar4->m_hatch_scale = 0.0;
      pOVar4->m_hatch_rotation = 0.0;
      pOVar4->m_background_fill_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar4->m_background_fill_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar4->m_boundary_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar4->m_boundary_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar4->m_hatch_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      pOVar4->m_hatch_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      *(undefined8 *)&pOVar4->m_boundary_visible = 0;
      pOVar4->m_boundary_width_scale = 0.0;
      pOVar4->m_background_fill_mode = Viewport;
      pOVar4->m_hatch_index = -0x7fffffff;
      pOVar4->m_hatch_scale = 1.0;
      OVar1 = ON_Color::UnsetColor;
      (pOVar4->m_background_fill_color).field_0 = ON_Color::UnsetColor.field_0;
      (pOVar4->m_background_fill_print_color).field_0 = OVar1.field_0;
      (pOVar4->m_boundary_color).field_0 = OVar1.field_0;
      (pOVar4->m_boundary_print_color).field_0 = OVar1.field_0;
      (pOVar4->m_hatch_color).field_0 = OVar1.field_0;
      (pOVar4->m_hatch_print_color).field_0 = OVar1.field_0;
      pOVar4->m_boundary_visible = true;
      pOVar4->m_boundary_width_scale = 3.0;
      (pOVar4->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pOVar4->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this->m_private = pOVar4;
    }
    if (print) {
      (pOVar4->m_boundary_print_color).field_0 = color->field_0;
    }
    else {
      (pOVar4->m_boundary_color).field_0 = color->field_0;
    }
  }
  return;
}

Assistant:

void ON_SectionStyle::SetBoundaryColor(const ON_Color& color, bool print)
{
  if (BoundaryColor(print) == color)
    return;
  if (nullptr == m_private)
    m_private = new ON_SectionStylePrivate();

  if (print)
    m_private->m_boundary_print_color = color;
  else
    m_private->m_boundary_color = color;
}